

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(short lhs,
         SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  unsigned_short uVar1;
  
  if (rhs.m_int == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (lhs == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (unsigned_short)((int)lhs / (int)(uint)rhs.m_int);
  }
  if (-1 < (short)uVar1) {
    return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)uVar1;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}